

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

void duckdb::ParquetMultiFileInfo::BindReader
               (ClientContext *context,vector<duckdb::LogicalType,_true> *return_types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,MultiFileBindData *bind_data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pHVar2;
  pointer pMVar3;
  pointer pTVar4;
  reference pvVar5;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> uVar6;
  long lVar7;
  pointer pMVar8;
  type pMVar9;
  BinderException *pBVar10;
  size_type __n;
  bool bVar11;
  vector<duckdb::LogicalType,_true> schema_col_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  schema_col_names;
  MultiFileColumnDefinition res;
  LogicalType local_90 [24];
  undefined1 local_78 [72];
  
  pTVar4 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  if (*(long *)(pTVar4 + 0x58) == *(long *)(pTVar4 + 0x60)) {
    pMVar8 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
             ::operator->(&bind_data->multi_file_reader);
    pMVar9 = shared_ptr<duckdb::MultiFileList,_true>::operator*(&bind_data->file_list);
    MultiFileReader::BindReader<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
              ((MultiFileReaderBindData *)&res,pMVar8,context,return_types,names,pMVar9,bind_data,
               (ParquetOptions *)(pTVar4 + 0x38),&bind_data->file_options);
    (bind_data->reader_bind).filename_idx.index = (idx_t)res.name._M_dataplus._M_p;
    local_78._0_8_ =
         (bind_data->reader_bind).hive_partitioning_indexes.
         super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
         .
         super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_78._8_8_ =
         (bind_data->reader_bind).hive_partitioning_indexes.
         super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
         .
         super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pHVar2 = (bind_data->reader_bind).hive_partitioning_indexes.
             super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
             .
             super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (bind_data->reader_bind).hive_partitioning_indexes.
    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)res.name._M_string_length;
    (bind_data->reader_bind).hive_partitioning_indexes.
    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT17(res.name.field_2._M_local_buf[7],
                           res.name.field_2._M_allocated_capacity._0_7_);
    (bind_data->reader_bind).hive_partitioning_indexes.
    super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
    super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT17(res.name.field_2._M_local_buf[0xf],res.name.field_2._8_7_);
    local_78._16_7_ = SUB87(pHVar2,0);
    local_78[0x17] = (undefined1)((ulong)pHVar2 >> 0x38);
    res.name._M_string_length = 0;
    res.name.field_2._M_allocated_capacity._0_7_ = 0;
    res.name.field_2._M_local_buf[7] = '\0';
    res.name.field_2._8_7_ = 0;
    res.name.field_2._M_local_buf[0xf] = '\0';
    std::vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>::
    ~vector((vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_> *
            )local_78);
    local_78._0_8_ =
         (bind_data->reader_bind).schema.
         super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
         .
         super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_78._8_8_ =
         (bind_data->reader_bind).schema.
         super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
         .
         super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pMVar3 = (bind_data->reader_bind).schema.
             super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
             .
             super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (bind_data->reader_bind).schema.
    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    .
    super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)res._32_8_;
    (bind_data->reader_bind).schema.
    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    .
    super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)res._40_8_;
    (bind_data->reader_bind).schema.
    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    .
    super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)res._48_8_;
    res._48_8_ = 0;
    local_78._16_7_ = SUB87(pMVar3,0);
    local_78[0x17] = (undefined1)((ulong)pMVar3 >> 0x38);
    res.type = (LogicalType)0x0;
    res._33_7_ = 0;
    res._40_8_ = 0;
    std::
    vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>::
    ~vector((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
             *)local_78);
    (bind_data->reader_bind).mapping =
         (MultiFileColumnMappingMode)
         res.children.
         super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
         .
         super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
         ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>::
    ~vector((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
             *)&res.type);
    std::vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>::
    ~vector((vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_> *
            )&res.name._M_string_length);
  }
  else {
    pTVar4 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
             ::operator->(&bind_data->bind_data);
    if (((bind_data->file_options).union_by_name != false) ||
       ((bind_data->file_options).hive_partitioning == true)) {
      pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
      res.name._M_dataplus._M_p = (pointer)&res.name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&res,
                 "Parquet schema cannot be combined with union_by_name=true or hive_partitioning=true"
                 ,"");
      duckdb::BinderException::BinderException(pBVar10,(string *)&res);
      __cxa_throw(pBVar10,&BinderException::typeinfo,std::runtime_error::~runtime_error);
    }
    schema_col_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    schema_col_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    schema_col_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    schema_col_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    schema_col_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    schema_col_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&schema_col_names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,(*(long *)(pTVar4 + 0x60) - *(long *)(pTVar4 + 0x58) >> 6) * -0x5555555555555555);
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::reserve
              (&schema_col_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               (*(long *)(pTVar4 + 0x60) - *(long *)(pTVar4 + 0x58) >> 6) * -0x5555555555555555);
    if (*(long *)(pTVar4 + 0x58) == *(long *)(pTVar4 + 0x60)) {
      bVar11 = false;
    }
    else {
      pvVar5 = vector<duckdb::ParquetColumnDefinition,_true>::operator[]
                         ((vector<duckdb::ParquetColumnDefinition,_true> *)(pTVar4 + 0x58),0);
      bVar11 = pvVar5->identifier == (Value)0xd;
    }
    if (*(long *)(pTVar4 + 0x60) != *(long *)(pTVar4 + 0x58)) {
      __n = 0;
      do {
        pvVar5 = vector<duckdb::ParquetColumnDefinition,_true>::operator[]
                           ((vector<duckdb::ParquetColumnDefinition,_true> *)(pTVar4 + 0x58),__n);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&schema_col_names.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,&pvVar5->name);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&schema_col_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &pvVar5->type);
        MultiFileColumnDefinition::MultiFileColumnDefinition(&res,&pvVar5->name,&pvVar5->type);
        duckdb::Value::operator=(&res.identifier,&pvVar5->identifier);
        uVar6._M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              )operator_new(0x78);
        duckdb::Value::Value((Value *)local_78,&pvVar5->default_value);
        duckdb::ConstantExpression::ConstantExpression
                  ((ConstantExpression *)
                   uVar6._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                   (Value *)local_78);
        duckdb::Value::~Value((Value *)local_78);
        if (res.default_expression.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
             )0x0) {
          lVar7 = *(long *)res.default_expression.
                           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          res.default_expression.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )uVar6._M_t.
                  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (**(code **)(lVar7 + 8))();
          uVar6._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                )(__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                  )res.default_expression.
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        }
        res.default_expression.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             uVar6._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        std::
        vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        ::emplace_back<duckdb::MultiFileColumnDefinition>
                  (&(bind_data->reader_bind).schema.
                    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                   ,&res);
        duckdb::Value::~Value(&res.identifier);
        if (res.default_expression.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)res.default_expression.
                                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        res.default_expression.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              )0x0;
        std::
        vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        ::~vector(&res.children.
                   super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 );
        duckdb::LogicalType::~LogicalType(&res.type);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res.name._M_dataplus._M_p != &res.name.field_2) {
          operator_delete(res.name._M_dataplus._M_p);
        }
        __n = __n + 1;
      } while (__n < (ulong)((*(long *)(pTVar4 + 0x60) - *(long *)(pTVar4 + 0x58) >> 6) *
                            -0x5555555555555555));
    }
    if (pTVar4[0x39] == (TableFunctionData)0x1) {
      paVar1 = &res.name.field_2;
      res.name.field_2._M_allocated_capacity._0_7_ = 0x6f725f656c6966;
      res.name.field_2._M_local_buf[7] = 'w';
      res.name.field_2._8_7_ = 0x7265626d756e5f;
      res.name._M_string_length = 0xf;
      res.name.field_2._M_local_buf[0xf] = '\0';
      res.name._M_dataplus._M_p = (pointer)paVar1;
      lVar7 = duckdb::StringUtil::CIFind((vector *)names,(string *)&res);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.name._M_dataplus._M_p != paVar1) {
        operator_delete(res.name._M_dataplus._M_p);
      }
      if (lVar7 != -1) {
        pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
        res.name._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&res,
                   "Using file_row_number option on file with column named file_row_number is not supported"
                   ,"");
        duckdb::BinderException::BinderException(pBVar10,(string *)&res);
        __cxa_throw(pBVar10,&BinderException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
                 (LogicalTypeId *)&LogicalType::BIGINT);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
                 (char (*) [16])"file_row_number");
    }
    if (pTVar4[0x39] == (TableFunctionData)0x1) {
      local_78._16_7_ = 0x6f725f656c6966;
      local_78[0x17] = 'w';
      local_78._24_7_ = 0x7265626d756e5f;
      local_78._8_8_ = (pointer)0xf;
      local_78[0x1f] = '\0';
      local_78._0_8_ = (pointer)(local_78 + 0x10);
      duckdb::LogicalType::LogicalType(local_90,BIGINT);
      MultiFileColumnDefinition::MultiFileColumnDefinition(&res,(string *)local_78,local_90);
      duckdb::LogicalType::~LogicalType(local_90);
      if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_);
      }
      duckdb::Value::INTEGER((int)local_78);
      duckdb::Value::operator=(&res.identifier,(Value *)local_78);
      duckdb::Value::~Value((Value *)local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&schema_col_names.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,&res.name);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&schema_col_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&res.type)
      ;
      std::
      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ::emplace_back<duckdb::MultiFileColumnDefinition>
                (&(bind_data->reader_bind).schema.
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 ,&res);
      duckdb::Value::~Value(&res.identifier);
      if (res.default_expression.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)res.default_expression.
                              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
                    + 8))();
      }
      res.default_expression.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      std::
      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ::~vector(&res.children.
                 super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
               );
      duckdb::LogicalType::~LogicalType(&res.type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)res.name._M_dataplus._M_p != &res.name.field_2) {
        operator_delete(res.name._M_dataplus._M_p);
      }
    }
    (bind_data->reader_bind).mapping = bVar11;
    pMVar8 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
             ::operator->(&bind_data->multi_file_reader);
    pMVar9 = shared_ptr<duckdb::MultiFileList,_true>::operator*(&bind_data->file_list);
    (**(code **)(*(long *)pMVar8 + 0x40))
              (pMVar8,&bind_data->file_options,pMVar9,&schema_col_types,&schema_col_names,
               &bind_data->reader_bind);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&names->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,&schema_col_names.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&return_types->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &schema_col_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&schema_col_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&schema_col_names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  }
  return;
}

Assistant:

void ParquetMultiFileInfo::BindReader(ClientContext &context, vector<LogicalType> &return_types, vector<string> &names,
                                      MultiFileBindData &bind_data) {
	auto &parquet_bind = bind_data.bind_data->Cast<ParquetReadBindData>();
	auto &options = parquet_bind.parquet_options;
	if (!options.schema.empty()) {
		BindSchema(context, return_types, names, bind_data);
	} else {
		bind_data.reader_bind = bind_data.multi_file_reader->BindReader<ParquetMultiFileInfo>(
		    context, return_types, names, *bind_data.file_list, bind_data, options, bind_data.file_options);
	}
}